

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_c_binding.cpp
# Opt level: O0

int __thiscall basis_file::open(basis_file *this,char *__file,int __oflag,...)

{
  ulong uVar1;
  basis_file *pbVar2;
  undefined1 local_1;
  
  this->m_file = (uint8_t *)__file;
  this->byteLength = __oflag;
  uVar1 = basist::basisu_transcoder::validate_header(&this->m_transcoder,(uint)__file);
  if ((uVar1 & 1) == 0) {
    this->m_file = (uint8_t *)0x0;
    this->byteLength = 0;
    local_1 = 0;
  }
  else {
    pbVar2 = (basis_file *)
             basist::basisu_transcoder::get_file_info
                       (&this->m_transcoder,(uint)this->m_file,
                        (basisu_file_info *)(ulong)this->byteLength);
    if (((ulong)pbVar2 & 1) == 0) {
      local_1 = 0;
      this = pbVar2;
    }
    else {
      this->m_magic = 0xdeadbee1;
      local_1 = 1;
    }
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),local_1);
}

Assistant:

bool basis_file::open(const uint8_t *buffer, uint32_t newByteLength) {
    m_file = buffer;
    byteLength = newByteLength;

    if (!m_transcoder.validate_header(buffer, newByteLength)) {
        m_file = nullptr;
        byteLength = 0;
        return false;
    }

    if (!m_transcoder.get_file_info(m_file, byteLength, fileinfo))
    {
        return false;
    }

    // Initialized after validation
    m_magic = MAGIC;
    return true;
}